

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::VideoTrack::VetEntry(VideoTrack *this,BlockEntry *pBlockEntry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  bVar1 = Track::VetEntry(&this->super_Track,pBlockEntry);
  if (bVar1) {
    iVar2 = (*pBlockEntry->_vptr_BlockEntry[2])(pBlockEntry);
    bVar1 = (bool)(*(byte *)(CONCAT44(extraout_var,iVar2) + 0x1a) >> 7);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VideoTrack::VetEntry(const BlockEntry* pBlockEntry) const {
  return Track::VetEntry(pBlockEntry) && pBlockEntry->GetBlock()->IsKey();
}